

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

RtMidiInPtr rtmidi_in_create_default(void)

{
  RtMidiIn *this;
  RtMidiError *err;
  string local_48;
  RtMidiIn *rIn;
  RtMidiWrapper *wrp;
  
  rIn = (RtMidiIn *)operator_new(0x20);
  this = (RtMidiIn *)operator_new(0x10);
  err._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"RtMidi Input Client",(allocator<char> *)((long)&err + 7));
  RtMidiIn::RtMidiIn(this,UNSPECIFIED,&local_48,100);
  err._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err + 7));
  (rIn->super_RtMidi)._vptr_RtMidi = (_func_int **)this;
  (rIn->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  *(undefined1 *)&rIn[1].super_RtMidi._vptr_RtMidi = 1;
  rIn[1].super_RtMidi.rtapi_ = (MidiApi *)0x11a9ce;
  return (RtMidiInPtr)rIn;
}

Assistant:

RtMidiInPtr rtmidi_in_create_default ()
{
    RtMidiWrapper* wrp = new RtMidiWrapper;

    try {
        RtMidiIn* rIn = new RtMidiIn ();

        wrp->ptr = (void*) rIn;
        wrp->data = 0;
        wrp->ok  = true;
        wrp->msg = "";

    } catch (const RtMidiError & err) {
        wrp->ptr = 0;
        wrp->data = 0;
        wrp->ok  = false;
        wrp->msg = err.what ();
    }

    return wrp;
}